

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printAssign(JSPrinter *this,Ref node)

{
  size_t sVar1;
  long lVar2;
  
  lVar2 = cashew::Value::asAssign();
  printChild(this,*(Value **)(lVar2 + 8),node,-1);
  space(this);
  maybeSpace(this,'=');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '=';
  space(this);
  printChild(this,*(Value **)(lVar2 + 0x18),node,1);
  return;
}

Assistant:

void printAssign(Ref node) {
    auto* assign = node->asAssign();
    printChild(assign->target(), node, -1);
    space();
    emit('=');
    space();
    printChild(assign->value(), node, 1);
  }